

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

void readTxa<TxaHeaderSwitch>(istream *stream,TxaHeader *header)

{
  bool bVar1;
  value_type_conflict4 vVar2;
  value_type_conflict3 vVar3;
  uint32_t uVar4;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *this;
  reference pvVar5;
  char *pcVar6;
  undefined1 *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  size_t stringLength;
  TxaChunkSwitch c;
  TxaChunk *chunk;
  iterator __end1;
  iterator __begin1;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *__range1;
  vector<char,_std::allocator<char>_> buffer;
  TxaHeaderSwitch h;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *in_stack_ffffffffffffff18;
  istream *in_stack_ffffffffffffff20;
  vector<TxaChunk,_std::allocator<TxaChunk>_> *this_00;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  string local_b8 [32];
  size_type local_98;
  reference local_68;
  TxaChunk *local_60;
  __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_> local_58;
  undefined1 *local_50;
  vector<TxaChunk,_std::allocator<TxaChunk>_> local_48 [2];
  undefined1 *local_10;
  vector<char,_std::allocator<char>_> *local_8;
  
  *in_RSI = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  readRaw<TxaHeaderSwitch>(in_stack_ffffffffffffff20);
  vVar3 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
                    ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                      *)0x1194f8);
  *(value_type_conflict3 *)(local_10 + 8) = vVar3;
  vVar3 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
                    ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                      *)0x119516);
  *(value_type_conflict3 *)(local_10 + 0xc) = vVar3;
  uVar4 = TxaHeaderSwitch::getIndexSize((TxaHeaderSwitch *)0x119530);
  *(uint32_t *)(local_10 + 0x10) = uVar4;
  this = (vector<TxaChunk,_std::allocator<TxaChunk>_> *)(local_10 + 0x18);
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *)
          0x11955f);
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::resize
            (this,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x11957a);
  local_50 = local_10 + 0x18;
  local_58._M_current =
       (TxaChunk *)
       std::vector<TxaChunk,_std::allocator<TxaChunk>_>::begin(in_stack_ffffffffffffff18);
  local_60 = (TxaChunk *)
             std::vector<TxaChunk,_std::allocator<TxaChunk>_>::end(in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                        *)in_stack_ffffffffffffff20,
                       (__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    local_68 = __gnu_cxx::
               __normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
               operator*(&local_58);
    readRaw<TxaChunkSwitch>(in_stack_ffffffffffffff20);
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x119609);
    local_68->index = vVar2;
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x119621);
    local_68->width = vVar2;
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x11963a);
    local_68->height = vVar2;
    vVar3 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                   *)0x119653);
    local_68->offset = vVar3;
    vVar3 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                   *)0x11966a);
    local_68->length = vVar3;
    uVar4 = TxaChunkSwitch::getDecLength((TxaChunkSwitch *)0x119681);
    local_68->decodedLength = uVar4;
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x1196a0);
    local_98 = (ulong)vVar2 - 0x14;
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)this,CONCAT44(uVar4,in_stack_ffffffffffffff38)
              );
    this_00 = local_48;
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)this_00,local_98);
    *pvVar5 = '\0';
    in_stack_ffffffffffffff30 = local_8;
    pcVar6 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1196f4);
    std::istream::read((char *)in_stack_ffffffffffffff30,(long)pcVar6);
    in_stack_ffffffffffffff18 = local_48;
    in_stack_ffffffffffffff20 =
         (istream *)
         std::vector<char,_std::allocator<char>_>::data
                   ((vector<char,_std::allocator<char>_> *)0x119719);
    pcVar6 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x119727);
    strlen(pcVar6);
    toUTF8_abi_cxx11_((char *)this_00,(size_t)in_stack_ffffffffffffff20);
    std::__cxx11::string::operator=((string *)&local_68->name,local_b8);
    std::__cxx11::string::~string(local_b8);
    __gnu_cxx::__normal_iterator<TxaChunk_*,_std::vector<TxaChunk,_std::allocator<TxaChunk>_>_>::
    operator++(&local_58);
  }
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void readTxa(std::istream& stream, TxaHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.indexed = h.indexed.value();
	header.largestDecodedChunk = h.largestDecodedChunk.value();
	header.indexSize = h.getIndexSize();
	header.chunks.resize(h.chunks.value());

	std::vector<char> buffer;

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.index = c.index.value();
		chunk.width = c.width.value();
		chunk.height = c.height.value();
		chunk.offset = c.entryOffset.value();
		chunk.length = c.entryLength.value();
		chunk.decodedLength = c.getDecLength();
		const size_t stringLength = c.headerLength.value() - sizeof(c);
		buffer.resize(stringLength + 1);
		buffer[stringLength] = 0;
		stream.read(buffer.data(), stringLength);
		chunk.name = toUTF8(buffer.data(), strlen(buffer.data()));
	}
}